

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.c
# Opt level: O0

void ma_copy_and_apply_volume_and_clip_samples_s24
               (ma_uint8 *pDst,ma_int64 *pSrc,ma_uint64 count,float volume)

{
  long local_70;
  long local_68;
  long local_60;
  ma_int64 s;
  ulong uStack_48;
  ma_int16 volumeFixed;
  ma_uint64 iSample;
  float volume_local;
  ma_uint64 count_local;
  ma_int64 *pSrc_local;
  ma_uint8 *pDst_local;
  
  if (pDst == (ma_uint8 *)0x0) {
    __assert_fail("pDst != ((void*)0)",
                  "/workspace/llm4binary/github/license_c_cmakelists/stoneface86[P]trackerboy/vendored/miniaudio/miniaudio.c"
                  ,0x76e6,
                  "void ma_copy_and_apply_volume_and_clip_samples_s24(ma_uint8 *, const ma_int64 *, ma_uint64, float)"
                 );
  }
  if (pSrc == (ma_int64 *)0x0) {
    __assert_fail("pSrc != ((void*)0)",
                  "/workspace/llm4binary/github/license_c_cmakelists/stoneface86[P]trackerboy/vendored/miniaudio/miniaudio.c"
                  ,0x76e7,
                  "void ma_copy_and_apply_volume_and_clip_samples_s24(ma_uint8 *, const ma_int64 *, ma_uint64, float)"
                 );
  }
  for (uStack_48 = 0; uStack_48 < count; uStack_48 = uStack_48 + 1) {
    local_70 = pSrc[uStack_48] * (long)(short)(int)(volume * 256.0) >> 8;
    local_60 = local_70;
    if (0x7ffffe < local_70) {
      local_60 = 0x7fffff;
    }
    if (local_60 < -0x800000) {
      local_68 = -0x800000;
    }
    else {
      if (0x7ffffe < local_70) {
        local_70 = 0x7fffff;
      }
      local_68 = local_70;
    }
    pDst[uStack_48 * 3] = (ma_uint8)local_68;
    pDst[uStack_48 * 3 + 1] = (ma_uint8)((ulong)local_68 >> 8);
    pDst[uStack_48 * 3 + 2] = (ma_uint8)((ulong)local_68 >> 0x10);
  }
  return;
}

Assistant:

MA_API void ma_copy_and_apply_volume_and_clip_samples_s24(ma_uint8* pDst, const ma_int64* pSrc, ma_uint64 count, float volume)
{
    ma_uint64 iSample;
    ma_int16  volumeFixed;

    MA_ASSERT(pDst != NULL);
    MA_ASSERT(pSrc != NULL);

    volumeFixed = ma_float_to_fixed_16(volume);

    for (iSample = 0; iSample < count; iSample += 1) {
        ma_int64 s = ma_clip_s24(ma_apply_volume_unclipped_s24(pSrc[iSample], volumeFixed));
        pDst[iSample*3 + 0] = (ma_uint8)((s & 0x000000FF) >>  0);
        pDst[iSample*3 + 1] = (ma_uint8)((s & 0x0000FF00) >>  8);
        pDst[iSample*3 + 2] = (ma_uint8)((s & 0x00FF0000) >> 16);
    }
}